

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkFinLocalSetup(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Int_t *vResArray)

{
  uint uVar1;
  int Entry;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  vResArray->nSize = 0;
  if (0 < vList->nSize) {
    lVar5 = 0;
    do {
      Entry = vList->pArray[lVar5];
      if (Entry < 0) {
LAB_002b387b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = Entry * 2;
      uVar2 = vPairs->nSize;
      if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + Entry * -2) < 0)
      goto LAB_002b387b;
      iVar3 = vPairs->pArray[uVar1];
      if (((long)iVar3 < 0) || (vMap2->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar4 = vMap2->pArray;
      Vec_IntPush(pVVar4 + iVar3,Entry);
      Vec_IntPush(pVVar4 + iVar3,(int)lVar5);
      Vec_IntPush(vResArray,Entry);
      Vec_IntPush(vResArray,(int)lVar5);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vList->nSize);
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetup( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Int_t * vResArray )
{
    int i, iFin;
    Vec_IntClear( vResArray );
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntPushTwo( vArray, iFin, i );
        Vec_IntPushTwo( vResArray, iFin, i );
    }
}